

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryop_x86.cpp
# Opt level: O0

int ncnn::binary_op_6_11_16_25<ncnn::BinaryOp_x86_functor::binary_op_mul>
              (Mat *a,Mat *b,Mat *c,Option *opt)

{
  undefined1 auVar1 [16];
  long *in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  bool bVar2;
  float fVar3;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  __m128 afVar4;
  __m128 _outp;
  __m128 _p;
  __m128 _b0;
  int i;
  float *outptr;
  float b0;
  float *ptr;
  int q;
  int size;
  int elempack;
  int channels;
  int d;
  int h;
  int w;
  binary_op_mul op;
  Mat *m;
  Mat *m_1;
  Allocator *in_stack_fffffffffffffce0;
  Mat *in_stack_fffffffffffffce8;
  Mat *in_stack_fffffffffffffcf0;
  undefined8 uStack_2d0;
  float local_2c8 [2];
  float afStack_2c0 [2];
  float local_2b8 [2];
  float afStack_2b0 [3];
  int local_2a4;
  undefined8 local_2a0;
  undefined8 local_298;
  undefined8 local_290;
  undefined4 local_288;
  long local_280;
  undefined4 local_278;
  undefined4 local_274;
  undefined4 local_270;
  undefined4 local_26c;
  undefined4 local_268;
  undefined8 local_260;
  float *local_258;
  float local_24c;
  undefined8 local_248;
  undefined8 local_240;
  undefined8 local_238;
  undefined4 local_230;
  long local_228;
  undefined4 local_220;
  undefined4 local_21c;
  undefined4 local_218;
  undefined4 local_214;
  undefined4 local_210;
  undefined8 local_208;
  float *local_200;
  int local_1f8;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  int local_1e8;
  int local_1e4;
  int local_1e0;
  binary_op_mul local_1d9 [9];
  long *local_1d0;
  undefined8 *local_1c8;
  long *local_1c0;
  int local_1b4;
  long *local_1b0;
  undefined1 local_1a5;
  int local_1a4;
  undefined8 *local_198;
  undefined8 *local_190;
  undefined8 *local_180;
  undefined8 *local_178;
  undefined1 local_16d;
  int local_16c;
  undefined8 *local_160;
  undefined8 *local_150;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  float local_138;
  float *pfStack_130;
  undefined8 local_128;
  undefined8 uStack_120;
  float *local_110;
  long *local_108;
  long local_100;
  undefined4 local_f4;
  long local_f0;
  float *local_e8;
  undefined4 local_dc;
  int local_d8;
  int local_d4;
  undefined8 *local_d0;
  long local_c8;
  undefined4 local_bc;
  long local_b8;
  float *local_b0;
  undefined4 local_a4;
  int local_a0;
  int local_9c;
  undefined8 *local_98;
  undefined4 local_8c;
  long local_88;
  undefined4 local_7c;
  long local_78;
  undefined8 *local_58;
  undefined8 *local_48;
  undefined8 local_10;
  
  local_1e0 = *(int *)((long)in_RDI + 0x2c);
  local_1e4 = (int)in_RDI[6];
  local_1e8 = *(int *)((long)in_RDI + 0x34);
  local_1ec = (int)in_RDI[7];
  local_1f0 = (int)in_RDI[3];
  local_1f4 = local_1e0 * local_1e4 * local_1e8 * local_1f0;
  local_1d0 = in_RDX;
  local_1c8 = in_RSI;
  local_1c0 = in_RDI;
  Mat::create_like(in_stack_fffffffffffffcf0,in_stack_fffffffffffffce8,in_stack_fffffffffffffce0);
  local_1b0 = local_1d0;
  bVar2 = true;
  if (*local_1d0 != 0) {
    local_108 = local_1d0;
    bVar2 = local_1d0[8] * (long)(int)local_1d0[7] == 0;
  }
  if (bVar2) {
    local_1b4 = -100;
  }
  else {
    for (local_1f8 = 0; local_1f8 < local_1ec; local_1f8 = local_1f8 + 1) {
      local_198 = &local_248;
      local_9c = *(int *)((long)local_1c0 + 0x2c);
      local_a0 = (int)local_1c0[6];
      local_a4 = *(undefined4 *)((long)local_1c0 + 0x34);
      local_200 = (float *)(*local_1c0 + local_1c0[8] * (long)local_1f8 * local_1c0[2]);
      local_b8 = local_1c0[2];
      local_bc = (undefined4)local_1c0[3];
      local_c8 = local_1c0[4];
      local_98 = &local_248;
      local_88 = (long)local_9c * (long)local_a0 * local_b8;
      local_190 = &local_248;
      local_180 = &local_248;
      local_24c = *(float *)*local_1c8;
      local_160 = &local_2a0;
      local_d4 = *(int *)((long)local_1d0 + 0x2c);
      local_d8 = (int)local_1d0[6];
      local_dc = *(undefined4 *)((long)local_1d0 + 0x34);
      local_258 = (float *)(*local_1d0 + local_1d0[8] * (long)local_1f8 * local_1d0[2]);
      local_f0 = local_1d0[2];
      local_f4 = (undefined4)local_1d0[3];
      local_100 = local_1d0[4];
      local_d0 = &local_2a0;
      local_78 = (long)local_d4 * (long)local_d8 * local_f0;
      local_150 = &local_2a0;
      local_178 = &local_2a0;
      local_210 = 0;
      local_214 = 0;
      local_218 = 0;
      local_21c = 0;
      local_230 = 0;
      local_238 = 0;
      local_240 = 0;
      local_248 = 0;
      local_10 = 0;
      local_7c = 0x10;
      local_8c = 0x10;
      local_16c = local_1f8;
      local_16d = 1;
      local_1a4 = local_1f8;
      local_1a5 = 1;
      local_208 = 0;
      local_220 = 0;
      local_2a0 = 0;
      local_290 = 0;
      local_288 = 0;
      local_278 = 0;
      local_274 = 0;
      local_270 = 0;
      local_26c = 0;
      local_268 = 0;
      local_260 = 0;
      local_298 = 0;
      local_2b8[1] = local_24c;
      local_2b8[0] = local_24c;
      afStack_2b0[1] = local_24c;
      afStack_2b0[0] = local_24c;
      local_148 = local_24c;
      fStack_144 = local_24c;
      fStack_140 = local_24c;
      fStack_13c = local_24c;
      local_138 = local_24c;
      local_e8 = local_258;
      local_b0 = local_200;
      local_58 = local_178;
      local_48 = local_180;
      local_280 = local_100;
      local_228 = local_c8;
      for (local_2a4 = 0; local_2a4 + 3 < local_1f4; local_2a4 = local_2a4 + 4) {
        pfStack_130 = local_200;
        local_2c8 = *(float (*) [2])local_200;
        afStack_2c0 = *(float (*) [2])(local_200 + 2);
        afVar4 = BinaryOp_x86_functor::binary_op_mul::func_pack4
                           (local_1d9,(__m128 *)local_2c8,(__m128 *)local_2b8);
        local_128 = afVar4._0_8_;
        auVar1._8_4_ = extraout_XMM0_Dc;
        auVar1._0_8_ = local_128;
        auVar1._12_4_ = extraout_XMM0_Dd;
        local_110 = local_258;
        uStack_2d0 = auVar1._8_8_;
        uStack_120 = uStack_2d0;
        *(undefined8 *)local_258 = local_128;
        *(undefined8 *)(local_258 + 2) = uStack_2d0;
        local_200 = local_200 + 4;
        local_258 = local_258 + 4;
      }
      for (; local_2a4 < local_1f4; local_2a4 = local_2a4 + 1) {
        fVar3 = BinaryOp_x86_functor::binary_op_mul::func(local_1d9,local_200,&local_24c);
        *local_258 = fVar3;
        local_200 = local_200 + 1;
        local_258 = local_258 + 1;
      }
    }
    local_1b4 = 0;
  }
  return local_1b4;
}

Assistant:

static int binary_op_6_11_16_25(const Mat& a, const Mat& b, Mat& c, const Option& opt)
{
    Op op;

    int w = a.w;
    int h = a.h;
    int d = a.d;
    int channels = a.c;
    int elempack = a.elempack;
    int size = w * h * d * elempack;

    // type 6 11 16 25
    c.create_like(a, opt.blob_allocator);
    if (c.empty())
        return -100;

    #pragma omp parallel for num_threads(opt.num_threads)
    for (int q = 0; q < channels; q++)
    {
        const float* ptr = a.channel(q);
        const float b0 = b[0];
        float* outptr = c.channel(q);

        int i = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        __m512 _b0_avx512 = _mm512_set1_ps(b0);
        for (; i + 15 < size; i += 16)
        {
            __m512 _p = _mm512_loadu_ps(ptr);
            __m512 _outp = op.func_pack16(_p, _b0_avx512);
            _mm512_storeu_ps(outptr, _outp);
            ptr += 16;
            outptr += 16;
        }
#endif // __AVX512F__
        __m256 _b0_avx = _mm256_set1_ps(b0);
        for (; i + 7 < size; i += 8)
        {
            __m256 _p = _mm256_loadu_ps(ptr);
            __m256 _outp = op.func_pack8(_p, _b0_avx);
            _mm256_storeu_ps(outptr, _outp);
            ptr += 8;
            outptr += 8;
        }
#endif // __AVX__
        __m128 _b0 = _mm_set1_ps(b0);
        for (; i + 3 < size; i += 4)
        {
            __m128 _p = _mm_load_ps(ptr);
            __m128 _outp = op.func_pack4(_p, _b0);
            _mm_store_ps(outptr, _outp);
            ptr += 4;
            outptr += 4;
        }
#endif // __SSE2__
        for (; i < size; i++)
        {
            *outptr = op.func(*ptr, b0);
            ptr += 1;
            outptr += 1;
        }
    }

    return 0;
}